

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.h
# Opt level: O3

void __thiscall
jaegertracing::testutils::TracerUtil::ResourceHandle::~ResourceHandle(ResourceHandle *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auStack_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  opentracing::v3::MakeNoopTracer();
  opentracing::v3::Tracer::InitGlobal(local_28,auStack_38);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  this_00 = (this->_mockAgent).
            super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

~ResourceHandle()
    {
        opentracing::Tracer::InitGlobal(opentracing::MakeNoopTracer());
    }